

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O1

void __thiscall PrintC::pushPrototypeInputs(PrintC *this,FuncProto *proto)

{
  uint uVar1;
  long *plVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  char *__end;
  FuncProto *pFVar6;
  string local_80;
  FuncProto *local_60;
  Atom local_58;
  undefined4 extraout_var;
  
  uVar1 = (*proto->store->_vptr_ProtoStore[5])();
  if ((uVar1 == 0) && ((proto->flags & 1) == 0)) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"void","");
    local_58.type = syntax;
    local_58.highlight = keyword_color;
    local_58.name = &local_80;
    PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_58);
  }
  else {
    local_60 = proto;
    if (1 < (int)uVar1) {
      iVar4 = uVar1 - 1;
      do {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&comma,(PcodeOp *)0x0);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    pFVar6 = local_60;
    if ((uVar1 != 0) && ((local_60->flags & 1) != 0)) {
      PrintLanguage::pushOp(&this->super_PrintLanguage,&comma,(PcodeOp *)0x0);
    }
    if (0 < (int)uVar1) {
      uVar5 = 0;
      do {
        iVar4 = (*pFVar6->store->_vptr_ProtoStore[6])(pFVar6->store,(ulong)uVar5);
        plVar2 = (long *)CONCAT44(extraout_var,iVar4);
        uVar3 = (**(code **)(*plVar2 + 0x18))(plVar2);
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6e])(this,uVar3,1);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"","");
        local_58.type = blanktoken;
        local_58.highlight = no_color;
        local_58.name = &local_80;
        PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        uVar3 = (**(code **)(*plVar2 + 0x18))(plVar2);
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6f])(this,uVar3);
        uVar5 = uVar5 + 1;
        pFVar6 = local_60;
      } while (uVar1 != uVar5);
    }
    if ((pFVar6->flags & 1) == 0) {
      return;
    }
    if (uVar1 == 0) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
      local_58.type = blanktoken;
      local_58.highlight = no_color;
      local_58.name = &local_80;
      PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_58);
    }
    else {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"...","");
      local_58.type = syntax;
      local_58.highlight = no_color;
      local_58.name = &local_80;
      PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_58);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return;
}

Assistant:

void PrintC::pushPrototypeInputs(const FuncProto *proto)

{
  int4 sz = proto->numParams();

  if ((sz == 0)&&(!proto->isDotdotdot()))
    pushAtom(Atom("void",syntax,EmitXml::keyword_color));
  else {
    for(int4 i=0;i<sz-1;++i)
      pushOp(&comma,(const PcodeOp *)0); // Print a comma for each parameter (above 1)
    if (proto->isDotdotdot()&&(sz!=0)) // Print comma for dotdotdot (if it is not by itself)
      pushOp(&comma,(const PcodeOp *)0);
    for(int4 i=0;i<sz;++i) {
      ProtoParameter *param = proto->getParam(i);
      pushTypeStart(param->getType(),true);
      pushAtom(Atom("",blanktoken,EmitXml::no_color));
      pushTypeEnd(param->getType());
    }
    if (proto->isDotdotdot()) {
      if (sz != 0)
	pushAtom(Atom("...",syntax,EmitXml::no_color));
      else {
	// In ANSI C, a prototype with empty parens means the parameters are unspecified (not void)
	// In C++, empty parens mean void, we use the ANSI C convention
	pushAtom(Atom("",blanktoken,EmitXml::no_color)); // An empty list of parameters
      }
    }
  }
}